

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexReader::readLargeMetaDataHeaders
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  byte bVar1;
  byte datatype;
  uint32_t datasize;
  uint uVar2;
  int zipsize_00;
  bool bVar3;
  byte *pbVar4;
  Entry *pEVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  FilePos local_58;
  byte *local_50;
  int local_44;
  byte *local_40;
  int local_34;
  
  local_58 = pos;
  local_44 = zipsize;
  seek(this,pos);
  local_40 = (byte *)(long)memsize;
  if (memsize < 0x4001) {
    pbVar4 = (byte *)((long)&local_58 - ((ulong)(local_40 + 0xf) & 0xfffffffffffffff0));
    pbVar7 = pbVar4;
  }
  else {
    pbVar4 = (byte *)operator_new__((ulong)(uint)memsize);
    pbVar7 = (byte *)&local_58;
  }
  zipsize_00 = local_44;
  local_50 = pbVar4;
  local_34 = memsize;
  pbVar7[-8] = 0x6f;
  pbVar7[-7] = 0x9d;
  pbVar7[-6] = 0x10;
  pbVar7[-5] = 0;
  pbVar7[-4] = 0;
  pbVar7[-3] = 0;
  pbVar7[-2] = 0;
  pbVar7[-1] = 0;
  bVar3 = readZipBlock(this,pbVar4,zipsize_00,memsize);
  if ((bVar3) && (0 < local_34)) {
    local_40 = local_40 + (long)local_50;
    lVar8 = zipsize_00 + local_58;
    pbVar4 = local_50;
    do {
      bVar1 = *pbVar4;
      pbVar6 = pbVar4 + (ulong)bVar1 + 10;
      datatype = pbVar4[(ulong)bVar1 + 1];
      datasize = *(uint32_t *)(pbVar4 + (ulong)bVar1 + 2);
      uVar2 = *(uint *)(pbVar4 + (ulong)bVar1 + 6);
      pbVar7[-8] = 0xb9;
      pbVar7[-7] = 0x9d;
      pbVar7[-6] = 0x10;
      pbVar7[-5] = 0;
      pbVar7[-4] = 0;
      pbVar7[-3] = 0;
      pbVar7[-2] = 0;
      pbVar7[-1] = 0;
      pEVar5 = MetaData::newEntry(metadata,bVar1 - 1,(char *)(pbVar4 + 1),datatype,datasize,
                                  metaDataMemUsed);
      pEVar5->isLmd = true;
      pEVar5->lmdData = (LargeMetaData *)0x0;
      pEVar5->lmdPos = lVar8;
      pEVar5->lmdZipSize = uVar2;
      lVar8 = lVar8 + (ulong)uVar2;
      pbVar4 = pbVar6;
    } while (pbVar6 < local_40);
  }
  pbVar4 = local_50;
  if (0x4000 < local_34) {
    pbVar7[-8] = 0xeb;
    pbVar7[-7] = 0x9d;
    pbVar7[-6] = 0x10;
    pbVar7[-5] = 0;
    pbVar7[-4] = 0;
    pbVar7[-3] = 0;
    pbVar7[-2] = 0;
    pbVar7[-1] = 0;
    operator_delete__(pbVar4);
  }
  return;
}

Assistant:

void PtexReader::readLargeMetaDataHeaders(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char [memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        pos += zipsize;

        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            uint32_t zipsizeval; memcpy(&zipsizeval, ptr, sizeof(zipsizeval));
            ptr += sizeof(zipsizeval);
            metadata->addLmdEntry((uint8_t)(keysize-1), key, datatypeval, datasize, pos, zipsizeval, metaDataMemUsed);
            pos += zipsizeval;
        }
    }
    if (useNew) delete [] buff;
}